

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_diag_left_multiply(Integer s_a,Integer g_d)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  Integer grp;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  Integer iproc;
  void *buf;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  int64_t *ilptr;
  int *iptr;
  void *vptr;
  Integer one;
  int64_t *jlptr;
  int *jptr;
  Integer khi;
  Integer klo;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  long local_b8;
  long local_b0;
  long local_a8;
  int local_9c;
  Integer local_98;
  Integer local_90;
  Integer local_88;
  ulong local_80;
  Integer local_78 [3];
  long local_60;
  long local_58;
  Integer local_50;
  Integer local_48;
  long local_40;
  long local_38;
  
  lVar24 = s_a + 1000;
  lVar23 = g_d + 1000;
  grp = SPA[lVar24].grp;
  local_88 = g_d;
  iproc = pnga_pgroup_nodeid(grp);
  local_98 = pnga_pgroup_nnodes(grp);
  lVar14 = SPA[lVar24].type;
  local_80 = (ulong)(uint)SPA[lVar24].idx_size;
  local_b0 = 0;
  local_78[2] = 0;
  local_b8 = 0;
  local_78[1] = 0;
  local_78[0] = 1;
  bVar25 = _ga_sync_begin != 0;
  local_9c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar25) {
    pnga_pgroup_sync(grp);
  }
  local_90 = grp;
  if (SPA[lVar24].idim != GA[lVar23].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don\'t match",0);
  }
  if (lVar14 != GA[lVar23].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don\'t match",0);
  }
  if (GA[lVar23].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }
  pnga_sprs_array_row_distribution(s_a,iproc,&local_38,&local_40);
  buf = malloc(((local_40 + 1) - local_38) * SPA[lVar24].size);
  local_58 = local_38 + 1;
  local_60 = local_40 + 1;
  pnga_get(local_88,&local_58,&local_60,buf,local_78);
  if (0 < local_98) {
    lVar24 = 0;
    lVar14 = lVar14 + -0x3e9;
    do {
      pnga_sprs_array_column_distribution(s_a,lVar24,&local_48,&local_50);
      if ((int)local_80 == 4) {
        pnga_sprs_array_access_col_block(s_a,lVar24,&local_b0,local_78 + 2,&local_a8);
        if (local_a8 != 0) {
          switch(lVar14) {
          case 0:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                lVar15 = lVar23 - local_38;
                iVar8 = *(int *)(local_b0 + lVar15 * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  uVar21 = (ulong)uVar16;
                  lVar17 = local_a8;
                  do {
                    lVar22 = (long)*(int *)(local_b0 + lVar15 * 4);
                    *(int *)(lVar17 + lVar22 * 4) =
                         *(int *)(lVar17 + lVar22 * 4) * *(int *)((long)buf + lVar15 * 4);
                    lVar17 = lVar17 + 4;
                    uVar21 = uVar21 - 1;
                  } while (uVar21 != 0);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 1:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b0 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar15 = local_a8 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    *(long *)(lVar15 + uVar21 * 8) =
                         *(long *)(lVar15 + uVar21 * 8) *
                         *(long *)((long)buf + (lVar23 - local_38) * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 2:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b0 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar15 = local_a8 + (long)iVar8 * 4;
                  uVar21 = 0;
                  do {
                    *(float *)(lVar15 + uVar21 * 4) =
                         *(float *)((long)buf + (lVar23 - local_38) * 4) *
                         *(float *)(lVar15 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 3:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b0 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar15 = local_a8 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    *(double *)(lVar15 + uVar21 * 8) =
                         *(double *)((long)buf + (lVar23 - local_38) * 8) *
                         *(double *)(lVar15 + uVar21 * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 5:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                lVar15 = lVar23 - local_38;
                iVar8 = *(int *)(local_b0 + lVar15 * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = local_a8 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    fVar2 = *(float *)((long)buf + (lVar15 * 2 + 1) * 4);
                    uVar6 = *(undefined8 *)(lVar17 + uVar21 * 8);
                    fVar3 = *(float *)((long)buf + lVar15 * 8);
                    fVar26 = (float)uVar6;
                    fVar27 = (float)((ulong)uVar6 >> 0x20);
                    *(ulong *)(lVar17 + uVar21 * 8) =
                         CONCAT44(fVar3 * fVar27 + fVar26 * fVar2,fVar3 * fVar26 + fVar27 * -fVar2);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 6:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                lVar15 = lVar23 - local_38;
                iVar8 = *(int *)(local_b0 + lVar15 * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = (long)iVar8 * 0x10 + local_a8;
                  lVar22 = 0;
                  do {
                    dVar4 = *(double *)((long)buf + (lVar15 * 2 + 1) * 8);
                    pdVar1 = (double *)(lVar17 + lVar22);
                    dVar12 = *pdVar1;
                    dVar13 = pdVar1[1];
                    dVar5 = *(double *)((long)buf + lVar15 * 0x10);
                    dVar11 = dVar5 * dVar13 + dVar12 * dVar4;
                    auVar9._8_4_ = SUB84(dVar11,0);
                    auVar9._0_8_ = dVar5 * dVar12 + dVar13 * -dVar4;
                    auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
                    *(undefined1 (*) [16])(lVar17 + lVar22) = auVar9;
                    lVar22 = lVar22 + 0x10;
                  } while ((ulong)uVar16 << 4 != lVar22);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 0xf:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b0 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b0 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar15 = local_a8 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    *(long *)(lVar15 + uVar21 * 8) =
                         *(long *)(lVar15 + uVar21 * 8) *
                         *(long *)((long)buf + (lVar23 - local_38) * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(s_a,lVar24,&local_b8,local_78 + 1,&local_a8);
        if (local_a8 != 0) {
          switch(lVar14) {
          case 0:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar17 = *(long *)(local_b8 + (lVar23 - local_38) * 8);
                if (lVar17 < lVar15) {
                  do {
                    *(int *)(local_a8 + lVar17 * 4) =
                         *(int *)(local_a8 + lVar17 * 4) *
                         *(int *)((long)buf + (lVar23 - local_38) * 4);
                    lVar17 = lVar17 + 1;
                  } while (lVar15 != lVar17);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 1:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = lVar23 - local_38;
                lVar17 = *(long *)(local_b8 + lVar19 * 8);
                lVar18 = lVar15 - lVar17;
                lVar22 = local_a8;
                if (lVar18 != 0 && lVar17 <= lVar15) {
                  do {
                    lVar15 = *(long *)(local_b8 + lVar19 * 8);
                    *(long *)(lVar22 + lVar15 * 8) =
                         *(long *)(lVar22 + lVar15 * 8) * *(long *)((long)buf + lVar19 * 8);
                    lVar18 = lVar18 + -1;
                    lVar22 = lVar22 + 8;
                  } while (lVar18 != 0);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 2:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar17 = *(long *)(local_b8 + (lVar23 - local_38) * 8);
                if (lVar17 < lVar15) {
                  do {
                    *(float *)(local_a8 + lVar17 * 4) =
                         *(float *)((long)buf + (lVar23 - local_38) * 4) *
                         *(float *)(local_a8 + lVar17 * 4);
                    lVar17 = lVar17 + 1;
                  } while (lVar15 != lVar17);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 3:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar17 = *(long *)(local_b8 + (lVar23 - local_38) * 8);
                if (lVar17 < lVar15) {
                  do {
                    *(double *)(local_a8 + lVar17 * 8) =
                         *(double *)((long)buf + (lVar23 - local_38) * 8) *
                         *(double *)(local_a8 + lVar17 * 8);
                    lVar17 = lVar17 + 1;
                  } while (lVar15 != lVar17);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 5:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar22 = lVar23 - local_38;
                lVar17 = *(long *)(local_b8 + lVar22 * 8);
                if (lVar17 < lVar15) {
                  do {
                    fVar2 = *(float *)((long)buf + (lVar22 * 2 + 1) * 4);
                    uVar6 = *(undefined8 *)(local_a8 + lVar17 * 8);
                    fVar3 = *(float *)((long)buf + lVar22 * 8);
                    fVar26 = (float)uVar6;
                    fVar27 = (float)((ulong)uVar6 >> 0x20);
                    *(ulong *)(local_a8 + lVar17 * 8) =
                         CONCAT44(fVar3 * fVar27 + fVar26 * fVar2,fVar3 * fVar26 + fVar27 * -fVar2);
                    lVar17 = lVar17 + 1;
                  } while (lVar15 != lVar17);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 6:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar18 = lVar23 - local_38;
                lVar17 = *(long *)(local_b8 + lVar18 * 8);
                lVar22 = lVar15 - lVar17;
                if (lVar22 != 0 && lVar17 <= lVar15) {
                  pauVar20 = (undefined1 (*) [16])(lVar17 * 0x10 + local_a8);
                  do {
                    dVar4 = *(double *)((long)buf + (lVar18 * 2 + 1) * 8);
                    dVar5 = *(double *)((long)buf + lVar18 * 0x10);
                    dVar11 = dVar5 * *(double *)(*pauVar20 + 8) + *(double *)*pauVar20 * dVar4;
                    auVar10._8_4_ = SUB84(dVar11,0);
                    auVar10._0_8_ =
                         dVar5 * *(double *)*pauVar20 + *(double *)(*pauVar20 + 8) * -dVar4;
                    auVar10._12_4_ = (int)((ulong)dVar11 >> 0x20);
                    *pauVar20 = auVar10;
                    pauVar20 = pauVar20 + 1;
                    lVar22 = lVar22 + -1;
                  } while (lVar22 != 0);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 0xf:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar15 = *(long *)(local_b8 + ((lVar23 + 1) - local_38) * 8);
                lVar17 = *(long *)(local_b8 + (lVar23 - local_38) * 8);
                if (lVar17 < lVar15) {
                  do {
                    *(long *)(local_a8 + lVar17 * 8) =
                         *(long *)(local_a8 + lVar17 * 8) *
                         *(long *)((long)buf + (lVar23 - local_38) * 8);
                    lVar17 = lVar17 + 1;
                  } while (lVar15 != lVar17);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
          }
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != local_98);
  }
  free(buf);
  if (local_9c != 0) {
    pnga_pgroup_sync(local_90);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_left_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_LEFT_MULTIPLY_M(_type,_iptr)                        \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        _ptr[_iptr[i-ilo]+j] = _buf[i-ilo]*_ptr[_iptr[i-ilo]+j];      \
      }                                                               \
    }                                                                 \
  }

#define SPRS_COMPLEX_LEFT_MULTIPLY_M(_type,_iptr)                     \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    _type rbuf, ibuf, rval, ival;                                     \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        rbuf = _buf[2*(i-ilo)];                                       \
        ibuf = _buf[2*(i-ilo)+1];                                     \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                              \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                            \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;               \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;             \
      }                                                               \
    }                                                                 \
  }

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vbuf = malloc((ihi-ilo+1)*SPA[hdl].size);
  klo = ilo+1;
  khi = ihi+1;
  pnga_get(g_d,&klo,&khi,vbuf,&one);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,iptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,iptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,iptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,iptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,iptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,ilptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,ilptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,ilptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,ilptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,ilptr);
        }
      }
    }
  }
  free(vbuf);

#undef SPRS_REAL_LEFT_MULTIPLY
#undef SPRS_COMPLEX_LEFT_MULTIPLY

  if (local_sync_end) pnga_pgroup_sync(grp);
}